

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<(anonymous_namespace)::Implicit_const&>::operator==
          (result *__return_storage_ptr__,
          expression_lhs<(anonymous_namespace)::Implicit_const&> *this,Implicit *rhs)

{
  int iVar1;
  int iVar2;
  Implicit *value;
  ostream *poVar3;
  ostringstream os;
  allocator<char> local_219;
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8;
  string local_1b8;
  ostringstream local_198 [376];
  
  value = *(Implicit **)this;
  iVar2 = value->x;
  iVar1 = rhs->x;
  std::__cxx11::string::string<std::allocator<char>>(local_218,"==",&local_219);
  std::__cxx11::ostringstream::ostringstream(local_198);
  to_string<(anonymous_namespace)::Implicit>(&local_1b8,value);
  poVar3 = std::operator<<((ostream *)local_198,(string *)&local_1b8);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,local_218);
  poVar3 = std::operator<<(poVar3," ");
  to_string<(anonymous_namespace)::Implicit>(&local_1d8,rhs);
  std::operator<<(poVar3,(string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  __return_storage_ptr__->passed = iVar2 == iVar1;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,local_1f8);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::~string(local_218);
  return __return_storage_ptr__;
}

Assistant:

result operator==( R const & rhs ) { return result( lhs == rhs, to_string( lhs, "==", rhs ) ); }